

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O1

int xmlEscapeEntities(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  xmlGenericErrorFunc p_Var3;
  int iVar4;
  long lVar5;
  xmlGenericErrorFunc *pp_Var6;
  void **ppvVar7;
  char *msg;
  byte *pbVar8;
  long lVar9;
  uint val;
  uint uVar10;
  byte *out_00;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  
  iVar4 = 0;
  iVar11 = (int)in;
  out_00 = out;
  iVar12 = iVar11;
  if (0 < *outlen && 0 < (long)*inlen) {
    pbVar13 = out + *outlen;
    pbVar8 = in + *inlen;
    do {
      bVar2 = *in;
      if (bVar2 == 0x26) {
        if ((long)pbVar13 - (long)out_00 < 5) goto LAB_001b0e2d;
        out_00[0] = 0x26;
        out_00[1] = 0x61;
        out_00[2] = 0x6d;
        out_00[3] = 0x70;
        out_00[4] = 0x3b;
        out_00 = out_00 + 5;
LAB_001b0c82:
        in = in + 1;
      }
      else {
        if (bVar2 == 0x3e) {
          if (3 < (long)pbVar13 - (long)out_00) {
            out_00[0] = 0x26;
            out_00[1] = 0x67;
            out_00[2] = 0x74;
            out_00[3] = 0x3b;
LAB_001b0c3f:
            out_00 = out_00 + 4;
            goto LAB_001b0c82;
          }
          goto LAB_001b0e2d;
        }
        uVar10 = (uint)bVar2;
        if (uVar10 == 0x3c) {
          if (3 < (long)pbVar13 - (long)out_00) {
            out_00[0] = 0x26;
            out_00[1] = 0x6c;
            out_00[2] = 0x74;
            out_00[3] = 0x3b;
            goto LAB_001b0c3f;
          }
          goto LAB_001b0e2d;
        }
        if (('\x1f' < (char)bVar2) || ((byte)(bVar2 - 9) < 2)) {
          *out_00 = bVar2;
          out_00 = out_00 + 1;
          goto LAB_001b0c82;
        }
        val = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          if ((long)pbVar13 - (long)out_00 < 0xb) goto LAB_001b0e2d;
          if (bVar2 < 0xc0) {
            msg = "string is not in UTF-8\n";
            iVar12 = 0x578;
LAB_001b0e6b:
            __xmlSimpleError(7,iVar12,(xmlNodePtr)0x0,msg,(char *)0x0);
            goto LAB_001b0e95;
          }
          if (bVar2 < 0xe0) {
            if ((long)pbVar8 - (long)in < 2) goto LAB_001b0e2d;
            uVar10 = (val & 0x1f) << 6;
            lVar9 = 2;
            lVar5 = 1;
          }
          else if (bVar2 < 0xf0) {
            if ((long)pbVar8 - (long)in < 3) goto LAB_001b0e2d;
            uVar10 = (in[1] & 0x3f | (val & 0xf) << 6) << 6;
            lVar9 = 3;
            lVar5 = 2;
          }
          else {
            if (0xf7 < bVar2) {
              msg = "invalid character value\n";
              iVar12 = 0x579;
              goto LAB_001b0e6b;
            }
            if ((long)pbVar8 - (long)in < 4) goto LAB_001b0e2d;
            uVar10 = (in[2] & 0x3f) << 6 | (in[1] & 0x3f | (uVar10 & 7) << 6) << 0xc;
            lVar9 = 4;
            lVar5 = 3;
          }
          pbVar1 = in + lVar5;
          uVar10 = *pbVar1 & 0x3f | uVar10;
          in = in + lVar9;
          if (uVar10 < 0x100) {
            if ((uVar10 < 0x20) && ((0xd < uVar10 || ((0x2600U >> (*pbVar1 & 0x1f) & 1) == 0)))) {
LAB_001b0e7a:
              __xmlSimpleError(7,0x579,(xmlNodePtr)0x0,"invalid character value\n",(char *)0x0);
              goto LAB_001b0e95;
            }
          }
          else if ((0xfffff < uVar10 - 0x10000 && 0x1ffd < uVar10 - 0xe000) && 0xd7ff < uVar10)
          goto LAB_001b0e7a;
          out_00 = xmlSerializeHexCharRef(out_00,uVar10);
        }
        else {
          if ((bVar2 < 0x20) && ((0xd < uVar10 || ((0x2600U >> (uVar10 & 0x1f) & 1) == 0)))) {
            pp_Var6 = __xmlGenericError();
            p_Var3 = *pp_Var6;
            ppvVar7 = __xmlGenericErrorContext();
            (*p_Var3)(*ppvVar7,"xmlEscapeEntities : char out of range\n");
LAB_001b0e95:
            iVar4 = -1;
            iVar12 = (int)in + 1;
            break;
          }
          if ((long)pbVar13 - (long)out_00 < 6) goto LAB_001b0e2d;
          in = in + 1;
          out_00 = xmlSerializeHexCharRef(out_00,val);
        }
      }
      if ((pbVar8 <= in) || (pbVar13 <= out_00)) goto LAB_001b0e2d;
    } while( true );
  }
LAB_001b0e33:
  *outlen = (int)out_00 - (int)out;
  *inlen = iVar12 - iVar11;
  return iVar4;
LAB_001b0e2d:
  iVar4 = 0;
  iVar12 = (int)in;
  goto LAB_001b0e33;
}

Assistant:

static int
xmlEscapeEntities(unsigned char* out, int *outlen,
                 const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    int val;

    inend = in + (*inlen);

    while ((in < inend) && (out < outend)) {
	if (*in == '<') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '>') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '&') {
	    if (outend - out < 5) break;
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (((*in >= 0x20) && (*in < 0x80)) ||
	           (*in == '\n') || (*in == '\t')) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *in++;
	    continue;
	} else if (*in >= 0x80) {
	    /*
	     * We assume we have UTF-8 input.
	     */
	    if (outend - out < 11) break;

	    if (*in < 0xC0) {
		xmlSaveErr(XML_SAVE_NOT_UTF8, NULL, NULL);
		in++;
		goto error;
	    } else if (*in < 0xE0) {
		if (inend - in < 2) break;
		val = (in[0]) & 0x1F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		in += 2;
	    } else if (*in < 0xF0) {
		if (inend - in < 3) break;
		val = (in[0]) & 0x0F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		in += 3;
	    } else if (*in < 0xF8) {
		if (inend - in < 4) break;
		val = (in[0]) & 0x07;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		val <<= 6;
		val |= (in[3]) & 0x3F;
		in += 4;
	    } else {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }
	    if (!IS_CHAR(val)) {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }

	    /*
	     * We could do multiple things here. Just save as a char ref
	     */
	    out = xmlSerializeHexCharRef(out, val);
	} else if (IS_BYTE_CHAR(*in)) {
	    if (outend - out < 6) break;
	    out = xmlSerializeHexCharRef(out, *in++);
	} else {
	    xmlGenericError(xmlGenericErrorContext,
		"xmlEscapeEntities : char out of range\n");
	    in++;
	    goto error;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
error:
    *outlen = out - outstart;
    *inlen = in - base;
    return(-1);
}